

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiDockNode *
DockBuilderCopyNodeRec
          (ImGuiDockNode *src_node,ImGuiID dst_node_id_if_known,
          ImVector<unsigned_int> *out_node_remap_pairs)

{
  ImGuiDockNodeFlags IVar1;
  ImGuiDockNode *v;
  ImGuiDockNode *pIVar2;
  long lVar3;
  
  v = ImGui::DockContextAddNode(GImGui,dst_node_id_if_known);
  IVar1 = src_node->LocalFlags;
  v->SharedFlags = src_node->SharedFlags;
  v->LocalFlags = IVar1;
  v->Pos = src_node->Pos;
  v->Size = src_node->Size;
  v->SizeRef = src_node->SizeRef;
  v->SplitAxis = src_node->SplitAxis;
  ImVector<unsigned_int>::push_back(out_node_remap_pairs,&src_node->ID);
  ImVector<unsigned_int>::push_back(out_node_remap_pairs,&v->ID);
  for (lVar3 = 3; lVar3 != 5; lVar3 = lVar3 + 1) {
    if (src_node->ChildNodes[lVar3 + -3] != (ImGuiDockNode *)0x0) {
      pIVar2 = DockBuilderCopyNodeRec(src_node->ChildNodes[lVar3 + -3],0,out_node_remap_pairs);
      v->ChildNodes[lVar3 + -3] = pIVar2;
      pIVar2->ParentNode = v;
    }
  }
  return v;
}

Assistant:

static ImGuiDockNode* DockBuilderCopyNodeRec(ImGuiDockNode* src_node, ImGuiID dst_node_id_if_known, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* dst_node = ImGui::DockContextAddNode(ctx, dst_node_id_if_known);
    dst_node->SharedFlags = src_node->SharedFlags;
    dst_node->LocalFlags = src_node->LocalFlags;
    dst_node->Pos = src_node->Pos;
    dst_node->Size = src_node->Size;
    dst_node->SizeRef = src_node->SizeRef;
    dst_node->SplitAxis = src_node->SplitAxis;

    out_node_remap_pairs->push_back(src_node->ID);
    out_node_remap_pairs->push_back(dst_node->ID);

    for (int child_n = 0; child_n < IM_ARRAYSIZE(src_node->ChildNodes); child_n++)
        if (src_node->ChildNodes[child_n])
        {
            dst_node->ChildNodes[child_n] = DockBuilderCopyNodeRec(src_node->ChildNodes[child_n], 0, out_node_remap_pairs);
            dst_node->ChildNodes[child_n]->ParentNode = dst_node;
        }

    IMGUI_DEBUG_LOG_DOCKING("Fork node %08X -> %08X (%d childs)\n", src_node->ID, dst_node->ID, dst_node->IsSplitNode() ? 2 : 0);
    return dst_node;
}